

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_reader.h
# Opt level: O0

void stl_reader::stl_reader_impl::
     RemoveDoubles<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
               (vector<double,_std::allocator<double>_> *uniqueCoordsOut,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *trisInOut,
               vector<double,_std::allocator<double>_> *normalsInOut,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *solidsInOut,
               vector<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
               *coordsWithIndexInOut)

{
  double dVar1;
  __normal_iterator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_*,_std::vector<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>_>
  __last;
  value_type vVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  double *pdVar7;
  reference pvVar8;
  ulong uVar9;
  vector<double,_std::allocator<double>_> *pvVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
  *in_R8;
  index_t j_2;
  index_t j_1;
  index_t ni [3];
  index_t newTriInd;
  index_t triInd;
  index_t i_3;
  index_t numUniqueTriInds;
  index_t j;
  CoordWithIndex<double,_unsigned_int> c;
  size_t i_2;
  index_t i_1;
  index_t curInd;
  vector<unsigned_int,_std::allocator<unsigned_int>_> newSolids;
  vector<unsigned_int,_std::allocator<unsigned_int>_> newIndex;
  size_t i;
  index_t numUnique;
  vector<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
  *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe98;
  value_type in_stack_fffffffffffffe9c;
  __normal_iterator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_*,_std::vector<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>_>
  in_stack_fffffffffffffea0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffea8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffeb0;
  uint local_f0;
  uint local_ec;
  value_type local_e8 [3];
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  double local_c8;
  double dStack_c0;
  double local_b8;
  ulong uStack_b0;
  ulong local_a0;
  uint local_98;
  value_type local_94;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  ulong local_48;
  int local_3c;
  CoordWithIndex<double,_unsigned_int> *local_38;
  CoordWithIndex<double,_unsigned_int> *local_30;
  vector<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
  *local_28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_20;
  vector<double,_std::allocator<double>_> *local_18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_10;
  vector<double,_std::allocator<double>_> *local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_30 = (CoordWithIndex<double,_unsigned_int> *)
             std::
             vector<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
             ::begin(in_stack_fffffffffffffe88);
  local_38 = (CoordWithIndex<double,_unsigned_int> *)
             std::
             vector<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
             ::end(in_stack_fffffffffffffe88);
  __last._M_current._4_4_ = in_stack_fffffffffffffe9c;
  __last._M_current._0_4_ = in_stack_fffffffffffffe98;
  std::
  sort<__gnu_cxx::__normal_iterator<stl_reader::stl_reader_impl::CoordWithIndex<double,unsigned_int>*,std::vector<stl_reader::stl_reader_impl::CoordWithIndex<double,unsigned_int>,std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,unsigned_int>>>>>
            (in_stack_fffffffffffffea0,__last);
  local_3c = 1;
  for (local_48 = 1; uVar9 = local_48,
      sVar4 = std::
              vector<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
              ::size(local_28), uVar9 < sVar4; local_48 = local_48 + 1) {
    std::
    vector<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
    ::operator[](local_28,local_48);
    std::
    vector<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
    ::operator[](local_28,local_48 - 1);
    bVar3 = CoordWithIndex<double,_unsigned_int>::operator!=
                      (in_stack_fffffffffffffea0._M_current,
                       (CoordWithIndex<double,_unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    if (bVar3) {
      local_3c = local_3c + 1;
    }
  }
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
  std::
  vector<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
  ::size(local_28);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x12845d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffeb0,
             (size_type)in_stack_fffffffffffffea8,
             (allocator_type *)in_stack_fffffffffffffea0._M_current);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x128483);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x128490);
  local_94 = 0;
  pvVar5 = std::
           vector<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
           ::operator[](local_28,0);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&local_60,(ulong)pvVar5->index);
  *pvVar6 = 0;
  for (local_98 = 0; local_98 < 3; local_98 = local_98 + 1) {
    pvVar5 = std::
             vector<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
             ::operator[](local_28,0);
    pdVar7 = CoordWithIndex<double,_unsigned_int>::operator[](pvVar5,(ulong)local_98);
    dVar1 = *pdVar7;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_8,(ulong)local_98);
    *pvVar8 = dVar1;
  }
  for (local_a0 = 1; uVar9 = local_a0,
      sVar4 = std::
              vector<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
              ::size(local_28), uVar9 < sVar4; local_a0 = local_a0 + 1) {
    pvVar5 = std::
             vector<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
             ::operator[](local_28,local_a0);
    local_c8 = pvVar5->data[0];
    dStack_c0 = pvVar5->data[1];
    local_b8 = pvVar5->data[2];
    uStack_b0 = *(ulong *)&pvVar5->index;
    std::
    vector<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
    ::operator[](local_28,local_a0 - 1);
    bVar3 = CoordWithIndex<double,_unsigned_int>::operator!=
                      (in_stack_fffffffffffffea0._M_current,
                       (CoordWithIndex<double,_unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    if (bVar3) {
      local_94 = local_94 + 1;
      for (local_cc = 0; local_cc < 3; local_cc = local_cc + 1) {
        pvVar5 = std::
                 vector<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>_>_>
                 ::operator[](local_28,local_a0);
        pdVar7 = CoordWithIndex<double,_unsigned_int>::operator[](pvVar5,(ulong)local_cc);
        dVar1 = *pdVar7;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (local_8,(ulong)(local_94 * 3 + local_cc));
        *pvVar8 = dVar1;
      }
    }
    vVar2 = local_94;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_60,uStack_b0 & 0xffffffff);
    *pvVar6 = vVar2;
  }
  local_d0 = 0;
  for (local_d4 = 0; uVar9 = (ulong)local_d4,
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_10),
      uVar9 < sVar4; local_d4 = local_d4 + 3) {
    local_d8 = local_d4 / 3;
    local_dc = local_d0 / 3;
    in_stack_fffffffffffffeb0 =
         (vector<double,_std::allocator<double>_> *)
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_90);
    pvVar10 = (vector<double,_std::allocator<double>_> *)
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_20);
    if (in_stack_fffffffffffffeb0 < pvVar10) {
      in_stack_fffffffffffffea8 = local_20;
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_90);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_stack_fffffffffffffea8,sVar4);
      if (*pvVar6 <= local_d8) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   in_stack_fffffffffffffea0._M_current,
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      }
    }
    for (local_ec = 0; local_ec < 3; local_ec = local_ec + 1) {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (local_10,(ulong)(local_d4 + local_ec));
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_60,(ulong)*pvVar6);
      local_e8[local_ec] = *pvVar6;
    }
    if (((local_e8[0] != local_e8[1]) && (local_e8[0] != local_e8[2])) &&
       (local_e8[1] != local_e8[2])) {
      for (local_f0 = 0; local_f0 < 3; local_f0 = local_f0 + 1) {
        in_stack_fffffffffffffe9c = local_e8[local_f0];
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (local_10,(ulong)(local_d0 + local_f0));
        *pvVar6 = in_stack_fffffffffffffe9c;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (local_18,(ulong)(local_d4 + local_f0));
        in_stack_fffffffffffffea0._M_current = (CoordWithIndex<double,_unsigned_int> *)*pvVar8;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (local_18,(ulong)(local_d0 + local_f0));
        *pvVar8 = (value_type)in_stack_fffffffffffffea0._M_current;
      }
      local_d0 = local_d0 + 3;
    }
  }
  this = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)local_d0;
  pvVar11 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_10);
  if (this < pvVar11) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffeb0,
               (size_type)in_stack_fffffffffffffea8);
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
  }
  bVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffea0._M_current);
  if (!bVar3) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (this,(value_type_conflict2 *)in_stack_fffffffffffffe88);
  }
  std::swap<unsigned_int,std::allocator<unsigned_int>>
            (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe88);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_fffffffffffffea0._M_current);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_fffffffffffffea0._M_current);
  return;
}

Assistant:

void RemoveDoubles (TNumberContainer1& uniqueCoordsOut,
                      TIndexContainer1& trisInOut,
                      TNumberContainer2& normalsInOut,
                      TIndexContainer2& solidsInOut,
                      std::vector <CoordWithIndex<
                        typename TNumberContainer1::value_type,
                        typename TIndexContainer1::value_type> >
                        &coordsWithIndexInOut)
  {
    using namespace std;

    typedef typename TNumberContainer1::value_type number_t;
    typedef typename TIndexContainer1::value_type  index_t;

    sort (coordsWithIndexInOut.begin(), coordsWithIndexInOut.end());
  
  //  first count unique indices
    index_t numUnique = 1;
    for(size_t i = 1; i < coordsWithIndexInOut.size(); ++i){
      if(coordsWithIndexInOut[i] != coordsWithIndexInOut[i - 1])
        ++numUnique;
    }

    uniqueCoordsOut.resize (numUnique * 3);
    vector<index_t> newIndex (coordsWithIndexInOut.size());

    TIndexContainer2 newSolids;

  //  copy unique coordinates to 'uniqueCoordsOut' and create an index-map
  //  'newIndex', which allows to re-index triangles later on.
    index_t curInd = 0;
    newIndex[coordsWithIndexInOut[0].index] = 0;
    for(index_t i = 0; i < 3; ++i)
      uniqueCoordsOut[i] = coordsWithIndexInOut[0][i];

    for(size_t i = 1; i < coordsWithIndexInOut.size(); ++i){
      const CoordWithIndex <number_t, index_t> c = coordsWithIndexInOut[i];
      if(c != coordsWithIndexInOut[i - 1]){
        ++curInd;
        for(index_t j = 0; j < 3; ++j)
          uniqueCoordsOut[curInd * 3 + j] = coordsWithIndexInOut[i][j];
      }

      newIndex[c.index] = static_cast<index_t> (curInd);
    }

  //  re-index triangles, so that they refer to 'uniqueCoordsOut'
  //  make sure to only add triangles which refer to three different indices
    index_t numUniqueTriInds = 0;
    for(index_t i = 0; i < trisInOut.size(); i+=3){
      
      const index_t triInd = i / 3;
      const index_t newTriInd = numUniqueTriInds / 3;
      if (newSolids.size () < solidsInOut.size () &&
          solidsInOut [newSolids.size ()] <= triInd)
      {
        newSolids.push_back (newTriInd);
      }

      index_t ni[3];
      for(index_t j = 0; j < 3; ++j)
        ni[j] = newIndex[trisInOut[i+j]];

      if((ni[0] != ni[1]) && (ni[0] != ni[2]) && (ni[1] != ni[2])){
        for(index_t j = 0; j < 3; ++j)
        {
          trisInOut[numUniqueTriInds + j] = ni[j];
          normalsInOut[numUniqueTriInds + j] = normalsInOut [i + j];
        }
        numUniqueTriInds += 3;
      }
    }

    if(numUniqueTriInds < trisInOut.size())
    {
      trisInOut.resize (numUniqueTriInds);
      normalsInOut.resize (numUniqueTriInds);
    }

    if (!newSolids.empty ())
      newSolids.push_back (numUniqueTriInds / 3);
    
    using std::swap;
    swap (solidsInOut, newSolids);
  }